

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskController.cpp
# Opt level: O0

void __thiscall Storage::Disk::Controller::Controller(Controller *this,Cycles clock_rate)

{
  IntType IVar1;
  Drive *this_00;
  Time local_2c [2];
  Controller *local_18;
  Controller *this_local;
  Cycles clock_rate_local;
  
  local_18 = this;
  this_local = (Controller *)clock_rate.super_WrappedInt<Cycles>.length_;
  ClockingHint::Source::Source(&this->super_Source);
  Drive::EventDelegate::EventDelegate(&this->super_EventDelegate);
  ClockingHint::Observer::Observer(&this->super_Observer);
  (this->super_Source)._vptr_Source = (_func_int **)&PTR_preferred_clocking_00ca9d38;
  (this->super_EventDelegate)._vptr_EventDelegate = (_func_int **)&PTR_process_event_00ca9d80;
  (this->super_Observer)._vptr_Observer = (_func_int **)&DAT_00ca9da8;
  Time::Time(&this->bit_length_);
  IVar1 = WrappedInt<Cycles>::as_integral((WrappedInt<Cycles> *)&this_local);
  this->clock_rate_multiplier_ =
       SUB168((ZEXT816(0) << 0x40 | ZEXT816(128000000)) / SEXT816(IVar1),0);
  IVar1 = WrappedInt<Cycles>::as_integral((WrappedInt<Cycles> *)&this_local);
  this->clock_rate_ = IVar1 * this->clock_rate_multiplier_;
  this->is_reading_ = true;
  DigitalPhaseLockedLoop<Storage::Disk::Controller,_3UL>::DigitalPhaseLockedLoop
            (&this->pll_,100,this);
  this_00 = &this->empty_drive_;
  IVar1 = WrappedInt<Cycles>::as_integral((WrappedInt<Cycles> *)&this_local);
  Drive::Drive(this_00,(int)IVar1,1,1,ShugartRDY);
  std::
  vector<std::unique_ptr<Storage::Disk::Drive,_std::default_delete<Storage::Disk::Drive>_>,_std::allocator<std::unique_ptr<Storage::Disk::Drive,_std::default_delete<Storage::Disk::Drive>_>_>_>
  ::vector(&this->drives_);
  this->drive_ = this_00;
  this->drive_selection_mask_ = 0xff;
  ClockingHint::Source::set_clocking_hint_observer(&this_00->super_Source,&this->super_Observer);
  Time::Time(local_2c,1);
  set_expected_bit_length(this,local_2c[0]);
  return;
}

Assistant:

Controller::Controller(Cycles clock_rate) :
		clock_rate_multiplier_(128000000 / clock_rate.as_integral()),
		clock_rate_(clock_rate.as_integral() * clock_rate_multiplier_),
		pll_(100, *this),
		empty_drive_(int(clock_rate.as_integral()), 1, 1),
		drive_(&empty_drive_) {
	empty_drive_.set_clocking_hint_observer(this);
	set_expected_bit_length(Time(1));
}